

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

char * luaL_gsub(lua_State *L,char *s,char *p,char *r)

{
  char *pcVar1;
  undefined1 local_2058 [8];
  luaL_Buffer b;
  size_t l;
  char *wild;
  char *r_local;
  char *p_local;
  char *s_local;
  lua_State *L_local;
  
  b.initb._8184_8_ = strlen(p);
  luaL_buffinit(L,(luaL_Buffer *)local_2058);
  p_local = s;
  while( true ) {
    pcVar1 = strstr(p_local,p);
    if (pcVar1 == (char *)0x0) break;
    luaL_addlstring((luaL_Buffer *)local_2058,p_local,(long)pcVar1 - (long)p_local);
    luaL_addstring((luaL_Buffer *)local_2058,r);
    p_local = pcVar1 + b.initb._8184_8_;
  }
  luaL_addstring((luaL_Buffer *)local_2058,p_local);
  luaL_pushresult((luaL_Buffer *)local_2058);
  pcVar1 = lua_tolstring(L,-1,(size_t *)0x0);
  return pcVar1;
}

Assistant:

LUALIB_API const char *luaL_gsub (lua_State *L, const char *s, const char *p,
                                                               const char *r) {
  const char *wild;
  size_t l = strlen(p);
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while ((wild = strstr(s, p)) != NULL) {
    luaL_addlstring(&b, s, wild - s);  /* push prefix */
    luaL_addstring(&b, r);  /* push replacement in place of pattern */
    s = wild + l;  /* continue after 'p' */
  }
  luaL_addstring(&b, s);  /* push last suffix */
  luaL_pushresult(&b);
  return lua_tostring(L, -1);
}